

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O3

float64_t bf_get_float64_le(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  
  uVar1 = bf_get_uint8(bfile);
  uVar2 = bf_get_uint8(bfile);
  uVar3 = bf_get_uint8(bfile);
  uVar4 = bf_get_uint8(bfile);
  uVar5 = bf_get_uint8(bfile);
  uVar6 = bf_get_uint8(bfile);
  uVar7 = bf_get_uint8(bfile);
  uVar8 = bf_get_uint8(bfile);
  return (float64_t)
         CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(uVar4,CONCAT12(uVar3,
                                                  CONCAT11(uVar2,uVar1)))))));
}

Assistant:

float64_t
bf_get_float64_le(
    bfile_t * bfile )
{
    union {
        float64_t real;
        uint8_t   bytes[8];
    } data;

#ifndef WORDS_BIGENDIAN
    data.bytes[0] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[7] = bf_get_uint8( bfile );
#else /* WORDS_BIGENDIAN */
    data.bytes[7] = bf_get_uint8( bfile );
    data.bytes[6] = bf_get_uint8( bfile );
    data.bytes[5] = bf_get_uint8( bfile );
    data.bytes[4] = bf_get_uint8( bfile );
    data.bytes[3] = bf_get_uint8( bfile );
    data.bytes[2] = bf_get_uint8( bfile );
    data.bytes[1] = bf_get_uint8( bfile );
    data.bytes[0] = bf_get_uint8( bfile );
#endif /* WORDS_BIGENDIAN */

    return data.real;
}